

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *config)

{
  allocator<char> local_49;
  string local_48;
  
  (this->super_SharedImpl<Catch::IReporter>).m_rc = 0;
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__JunitReporter_001b71e8;
  ReporterConfig::ReporterConfig(&this->m_config,config);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"AllTests",&local_49);
  Stats::Stats(&this->m_testSuiteStats,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->m_currentStats = &this->m_testSuiteStats;
  (this->m_statsForSuites).
  super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_statsForSuites).
  super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_statsForSuites).
  super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stdOut);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stdErr);
  return;
}

Assistant:

JunitReporter( const ReporterConfig& config )
        :   m_config( config ),
            m_testSuiteStats( "AllTests" ),
            m_currentStats( &m_testSuiteStats )
        {}